

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Try * __thiscall
wasm::Builder::makeTry
          (Builder *this,Name name,Expression *body,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *catchTags,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *catchBodies,
          Name delegateTarget,optional<wasm::Type> type)

{
  Try *pTVar1;
  Try *ret;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *catchBodies_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *catchTags_local;
  Expression *body_local;
  Builder *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  pTVar1 = MixedArena::alloc<wasm::Try>(&this->wasm->allocator);
  Name::operator=(&pTVar1->name,(Name *)&this_local);
  pTVar1->body = body;
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&pTVar1->catchTags,catchTags);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
             &pTVar1->catchBodies,catchBodies);
  wasm::Try::finalize(pTVar1,type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::Type>._M_payload,
                      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Type>._8_8_ & 0xff);
  return pTVar1;
}

Assistant:

Try* makeTry(Name name,
               Expression* body,
               const std::vector<Name>& catchTags,
               const std::vector<Expression*>& catchBodies,
               Name delegateTarget,
               std::optional<Type> type = std::nullopt) {
    auto* ret = wasm.allocator.alloc<Try>();
    ret->name = name;
    ret->body = body;
    ret->catchTags.set(catchTags);
    ret->catchBodies.set(catchBodies);
    ret->finalize(type);
    return ret;
  }